

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int ipairsaux(lua_State *L)

{
  int iVar1;
  int iVar2;
  lua_Integer lVar3;
  lua_State *in_RDI;
  lua_State *unaff_retaddr;
  int i;
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  lVar3 = luaL_checkinteger((lua_State *)
                            CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                            in_stack_ffffffffffffffec);
  iVar1 = (int)lVar3;
  luaL_checktype((lua_State *)CONCAT44(iVar1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec,
                 in_stack_ffffffffffffffe8);
  lua_pushinteger(in_RDI,(long)(iVar1 + 1));
  lua_rawgeti(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  iVar1 = lua_type(unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
  iVar2 = 2;
  if (iVar1 == 0) {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int ipairsaux(lua_State*L){
int i=luaL_checkint(L,2);
luaL_checktype(L,1,5);
i++;
lua_pushinteger(L,i);
lua_rawgeti(L,1,i);
return(lua_isnil(L,-1))?0:2;
}